

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

size_t __thiscall Lodtalk::MethodAssembler::SendMessage::computeMaxSize(SendMessage *this)

{
  size_t count;
  SendMessage *this_local;
  
  if ((((this->argumentCount == 0) && (this->selectorIndex < 0x10)) ||
      ((this->argumentCount == 1 && (this->selectorIndex < 0x10)))) ||
     ((this->argumentCount == 2 && (this->selectorIndex < 0x10)))) {
    this_local = (SendMessage *)0x1;
  }
  else {
    if (7 < this->argumentCount) {
      fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
              "virtual size_t Lodtalk::MethodAssembler::SendMessage::computeMaxSize()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MethodBuilder.cpp"
              ,0x220);
      abort();
    }
    if (0x1f < this->selectorIndex) {
      fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
              "virtual size_t Lodtalk::MethodAssembler::SendMessage::computeMaxSize()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MethodBuilder.cpp"
              ,0x223);
      abort();
    }
    this_local = (SendMessage *)0x2;
  }
  return (size_t)this_local;
}

Assistant:

virtual size_t computeMaxSize()
	{
		if((argumentCount == 0 && selectorIndex < BytecodeSet::SendShortArgs0RangeSize) ||
			(argumentCount == 1 && selectorIndex < BytecodeSet::SendShortArgs1RangeSize) ||
			(argumentCount == 2 && selectorIndex < BytecodeSet::SendShortArgs2RangeSize))
			return 1;

		size_t count = 2;

		if(argumentCount > BytecodeSet::Send_ArgumentCountMask)
			LODTALK_UNIMPLEMENTED();

 		if(selectorIndex > BytecodeSet::Send_LiteralIndexMask)
			LODTALK_UNIMPLEMENTED();
		return count;
	}